

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

RangeSelectSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RangeSelectSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,SyntaxKind *args,ExpressionSyntax *args_1,Token *args_2,
          ExpressionSyntax *args_3)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  RangeSelectSyntax *pRVar6;
  
  pRVar6 = (RangeSelectSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RangeSelectSyntax *)this->endPtr < pRVar6 + 1) {
    pRVar6 = (RangeSelectSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pRVar6 + 1);
  }
  TVar2 = args_2->kind;
  uVar3 = args_2->field_0x2;
  NVar4.raw = (args_2->numFlags).raw;
  uVar5 = args_2->rawLen;
  pIVar1 = args_2->info;
  (pRVar6->super_SelectorSyntax).super_SyntaxNode.kind = *args;
  (pRVar6->super_SelectorSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pRVar6->super_SelectorSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pRVar6->left).ptr = args_1;
  (pRVar6->range).kind = TVar2;
  (pRVar6->range).field_0x2 = uVar3;
  (pRVar6->range).numFlags = (NumericTokenFlags)NVar4.raw;
  (pRVar6->range).rawLen = uVar5;
  (pRVar6->range).info = pIVar1;
  (pRVar6->right).ptr = args_3;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pRVar6;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pRVar6;
  return pRVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }